

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O2

string * __thiscall CLI::getBinary_abi_cxx11_(string *__return_storage_ptr__,CLI *this)

{
  A2 *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (this->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 ==
      (this->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"raw",&local_39);
    A2::attribute(__return_storage_ptr__,this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CLI::getBinary () const
{
  if (! _args.empty ())
    return _args[0].attribute ("raw");

  return "";
}